

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_explain.hpp
# Opt level: O2

void __thiscall duckdb::LogicalExplain::~LogicalExplain(LogicalExplain *this)

{
  ~LogicalExplain(this);
  operator_delete(this);
  return;
}

Assistant:

explicit LogicalExplain(ExplainType explain_type)
	    : LogicalOperator(LogicalOperatorType::LOGICAL_EXPLAIN), explain_type(explain_type) {}